

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

void __thiscall
CVmObjLookupTable::for_each
          (CVmObjLookupTable *this,_func_void_vm_val_t_ptr_vm_val_t_ptr_void_ptr *cb,void *ctx)

{
  vm_lookup_ext *this_00;
  undefined8 in_RDX;
  code *in_RSI;
  CVmObjLookupTable *in_RDI;
  uint i;
  vm_lookup_val *entry;
  uint local_24;
  vm_lookup_val *local_20;
  
  local_24 = get_entry_count((CVmObjLookupTable *)0x3162c2);
  this_00 = get_ext(in_RDI);
  local_20 = vm_lookup_ext::idx_to_val(this_00,0);
  for (; local_24 != 0; local_24 = local_24 - 1) {
    if ((local_20->key).typ != VM_EMPTY) {
      (*in_RSI)(local_20,&local_20->val,in_RDX);
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void CVmObjLookupTable::for_each(
    VMG_ void (*cb)(VMG_ const vm_val_t *key,
                    const vm_val_t *val, void *ctx), void *ctx)
{
    vm_lookup_val *entry;
    uint i;

    /* iterate over each bucket */
    for (i = get_entry_count(), entry = get_ext()->idx_to_val(0) ;
         i != 0 ; --i, ++entry)
    {
        /* 
         *   if it's in use (i.e., if the key is non-empty), invoke the
         *   callback for the entry 
         */
        if (entry->key.typ != VM_EMPTY)
            (*cb)(vmg_ &entry->key, &entry->val, ctx);
    }
}